

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::PrintTestPartResultToString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TestPartResult *test_part_result)

{
  size_t sVar1;
  int in_ECX;
  pointer *__ptr;
  internal *this_00;
  ostream *poVar2;
  char *pcVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  string local_40;
  
  Message::Message((Message *)&local_48);
  this_00 = *(internal **)(this + 0x10);
  if (this_00 != (internal *)0x0) {
    this_00 = *(internal **)(this + 8);
  }
  FormatFileLocation_abi_cxx11_(&local_40,this_00,(char *)(ulong)*(uint *)(this + 0x28),in_ECX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10),local_40._M_dataplus._M_p,
             local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48._M_head_impl + 0x10)," ",1);
  if ((ulong)*(uint *)this < 4) {
    pcVar3 = &DAT_004cf208 + *(int *)(&DAT_004cf208 + (ulong)*(uint *)this * 4);
  }
  else {
    pcVar3 = "Unknown result type";
  }
  poVar2 = (ostream *)(local_48._M_head_impl + 0x10);
  sVar1 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar1);
  pcVar3 = *(char **)(this + 0x50);
  poVar2 = (ostream *)(local_48._M_head_impl + 0x10);
  if (pcVar3 == (char *)0x0) {
    sVar1 = 6;
    pcVar3 = "(null)";
  }
  else {
    sVar1 = strlen(pcVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar1);
  StringStreamToString(__return_storage_ptr__,local_48._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_48._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message() << internal::FormatFileLocation(
                           test_part_result.file_name(),
                           test_part_result.line_number())
                    << " "
                    << TestPartResultTypeToString(test_part_result.type())
                    << test_part_result.message())
      .GetString();
}